

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c
# Opt level: O3

cf_int32_t cf_datetime_day_of_year(cf_datetime_t *dt)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = *(ulong *)dt;
  iVar2 = 0;
  bVar5 = false;
  if ((uVar1 & 3) == 0) {
    bVar5 = 0x28f < (ushort)(((ushort)uVar1 & 0xffc) * 0x5c29) >> 2;
  }
  uVar3 = (uint)(uVar1 >> 0xc) & 0xf;
  if ((uVar1 >> 0xc & 0xf) != 0) {
    uVar4 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (uint)"\x1f\x1c\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f"[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return ((uint)uVar1 >> 0x10 & 0x1f) + (uint)(byte)(2 < uVar3 & bVar5) + iVar2;
}

Assistant:

cf_int32_t cf_datetime_day_of_year(const cf_datetime_t* dt) {
    cf_int32_t d = 0;
    cf_uint32_t i;
    cf_bool_t leap_year = CF_FALSE;
    leap_year = CF_IS_LEAP_YEAR(dt->year);
    for (i = 0; i < dt->month; i++) {
        d += g_mondays[i];
    }
    if (dt->month > 2 && leap_year) d++;
    d += dt->day;
    return d;
}